

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int PAL_putchar(int c)

{
  int iVar1;
  INT nRetVal;
  int c_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = putchar(c);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return iVar1;
}

Assistant:

int
_cdecl
PAL_putchar( int c )
{
    INT nRetVal = 0;

    PERF_ENTRY(putchar);
    ENTRY( "putchar( 0x%x (%c) )\n", c, c);

    nRetVal = putchar( c );

    LOGEXIT( "putchar returning %d\n", nRetVal );
    PERF_EXIT(putchar);
    return nRetVal;
}